

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O2

void cdef_filter_16_2_avx2
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar23 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  
  lVar11 = (long)dir;
  lVar3 = (long)cdef_directions_padded[lVar11 + 4][0];
  lVar4 = (long)cdef_directions_padded[lVar11 + 4][1];
  lVar7 = (long)cdef_directions_padded[lVar11][0];
  lVar11 = (long)cdef_directions_padded[lVar11][1];
  auVar27._0_2_ = (undefined2)sec_strength;
  if (block_width == 8) {
    uVar5 = sec_damping;
    if (sec_strength != 0) {
      iVar2 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar5 = sec_damping - iVar2;
      if (sec_damping < iVar2) {
        uVar5 = 0;
      }
    }
    auVar27._2_2_ = auVar27._0_2_;
    auVar27._4_2_ = auVar27._0_2_;
    auVar27._6_2_ = auVar27._0_2_;
    auVar27._8_2_ = auVar27._0_2_;
    auVar27._10_2_ = auVar27._0_2_;
    auVar27._12_2_ = auVar27._0_2_;
    auVar27._14_2_ = auVar27._0_2_;
    auVar27._16_2_ = auVar27._0_2_;
    auVar27._18_2_ = auVar27._0_2_;
    auVar27._20_2_ = auVar27._0_2_;
    auVar27._22_2_ = auVar27._0_2_;
    auVar27._24_2_ = auVar27._0_2_;
    auVar27._26_2_ = auVar27._0_2_;
    auVar27._28_2_ = auVar27._0_2_;
    auVar27._30_2_ = auVar27._0_2_;
    auVar15._8_2_ = 2;
    auVar15._0_8_ = 0x2000200020002;
    auVar15._10_2_ = 2;
    auVar15._12_2_ = 2;
    auVar15._14_2_ = 2;
    auVar15._16_2_ = 2;
    auVar15._18_2_ = 2;
    auVar15._20_2_ = 2;
    auVar15._22_2_ = 2;
    auVar15._24_2_ = 2;
    auVar15._26_2_ = 2;
    auVar15._28_2_ = 2;
    auVar15._30_2_ = 2;
    auVar17._8_2_ = 1;
    auVar17._0_8_ = 0x1000100010001;
    auVar17._10_2_ = 1;
    auVar17._12_2_ = 1;
    auVar17._14_2_ = 1;
    auVar17._16_2_ = 1;
    auVar17._18_2_ = 1;
    auVar17._20_2_ = 1;
    auVar17._22_2_ = 1;
    auVar17._24_2_ = 1;
    auVar17._26_2_ = 1;
    auVar17._28_2_ = 1;
    auVar17._30_2_ = 1;
    auVar18._8_2_ = 8;
    auVar18._0_8_ = 0x8000800080008;
    auVar18._10_2_ = 8;
    auVar18._12_2_ = 8;
    auVar18._14_2_ = 8;
    auVar18._16_2_ = 8;
    auVar18._18_2_ = 8;
    auVar18._20_2_ = 8;
    auVar18._22_2_ = 8;
    auVar18._24_2_ = 8;
    auVar18._26_2_ = 8;
    auVar18._28_2_ = 8;
    auVar18._30_2_ = 8;
    for (lVar9 = 0; lVar9 < block_height; lVar9 = lVar9 + 2) {
      auVar20._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])in +
           ZEXT116(1) * *(undefined1 (*) [16])((long)in + 0x120);
      auVar20._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * *(undefined1 (*) [16])in;
      auVar19 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar3 * 2));
      auVar22 = vlddqu_avx(*(undefined1 (*) [16])
                            (*(undefined1 (*) [16])((long)in + 0x120) + lVar3 * 2));
      auVar24._16_16_ = auVar19;
      auVar24._0_16_ = auVar22;
      auVar19 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar3 * -2));
      auVar22 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar3 * -2 + 0x120));
      auVar34._16_16_ = auVar19;
      auVar34._0_16_ = auVar22;
      auVar19 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar7 * 2));
      auVar22 = vlddqu_avx(*(undefined1 (*) [16])
                            (*(undefined1 (*) [16])((long)in + 0x120) + lVar7 * 2));
      auVar47._16_16_ = auVar19;
      auVar47._0_16_ = auVar22;
      auVar19 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar7 * -2));
      auVar22 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar7 * -2 + 0x120));
      auVar60._16_16_ = auVar19;
      auVar60._0_16_ = auVar22;
      auVar25 = vpsubw_avx2(auVar24,auVar20);
      auVar70 = vpsraw_avx2(auVar25,0xf);
      auVar25 = vpabsw_avx2(auVar25);
      auVar36 = vpsrlw_avx2(auVar25,ZEXT416(uVar5));
      auVar36 = vpsubusw_avx2(auVar27,auVar36);
      auVar25 = vpminsw_avx2(auVar36,auVar25);
      auVar36 = vpaddw_avx2(auVar70,auVar25);
      auVar25 = vpsubw_avx2(auVar34,auVar20);
      auVar71 = vpsraw_avx2(auVar25,0xf);
      auVar25 = vpabsw_avx2(auVar25);
      auVar16 = vpsrlw_avx2(auVar25,ZEXT416(uVar5));
      auVar16 = vpsubusw_avx2(auVar27,auVar16);
      auVar25 = vpminsw_avx2(auVar16,auVar25);
      auVar25 = vpaddw_avx2(auVar71,auVar25);
      auVar36 = vpaddw_avx2(auVar71 ^ auVar25,auVar70 ^ auVar36);
      auVar70 = vpsubw_avx2(auVar47,auVar20);
      auVar25 = vpabsw_avx2(auVar70);
      auVar14 = ZEXT416(uVar5);
      auVar16 = vpsrlw_avx2(auVar25,auVar14);
      auVar71 = vpsraw_avx2(auVar70,0xf);
      auVar16 = vpsubusw_avx2(auVar27,auVar16);
      auVar25 = vpminsw_avx2(auVar25,auVar16);
      auVar16 = vpaddw_avx2(auVar25,auVar71);
      auVar25 = vpsubw_avx2(auVar60,auVar20);
      auVar61 = vpsraw_avx2(auVar25,0xf);
      auVar25 = vpabsw_avx2(auVar25);
      auVar70 = vpsrlw_avx2(auVar25,auVar14);
      auVar70 = vpsubusw_avx2(auVar27,auVar70);
      auVar25 = vpminsw_avx2(auVar25,auVar70);
      auVar25 = vpaddw_avx2(auVar25,auVar61);
      auVar25 = vpaddw_avx2(auVar25 ^ auVar61,auVar16 ^ auVar71);
      auVar25 = vpaddw_avx2(auVar36,auVar25);
      auVar70 = vpmullw_avx2(auVar25,auVar15);
      auVar19 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar4 * 2));
      auVar22 = vlddqu_avx(*(undefined1 (*) [16])
                            (*(undefined1 (*) [16])((long)in + 0x120) + lVar4 * 2));
      auVar35._16_16_ = auVar19;
      auVar35._0_16_ = auVar22;
      auVar19 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar4 * -2));
      auVar22 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar4 * -2 + 0x120));
      auVar48._16_16_ = auVar19;
      auVar48._0_16_ = auVar22;
      auVar19 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar11 * 2));
      auVar22 = vlddqu_avx(*(undefined1 (*) [16])
                            (*(undefined1 (*) [16])((long)in + 0x120) + lVar11 * 2));
      auVar62._16_16_ = auVar19;
      auVar62._0_16_ = auVar22;
      auVar19 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar11 * -2));
      auVar22 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar11 * -2 + 0x120));
      auVar72._16_16_ = auVar19;
      auVar72._0_16_ = auVar22;
      auVar25 = vpsubw_avx2(auVar35,auVar20);
      auVar71 = vpsraw_avx2(auVar25,0xf);
      auVar25 = vpabsw_avx2(auVar25);
      auVar36 = vpsrlw_avx2(auVar25,auVar14);
      auVar36 = vpsubusw_avx2(auVar27,auVar36);
      auVar25 = vpminsw_avx2(auVar36,auVar25);
      auVar36 = vpaddw_avx2(auVar71,auVar25);
      auVar25 = vpsubw_avx2(auVar48,auVar20);
      auVar61 = vpsraw_avx2(auVar25,0xf);
      auVar25 = vpabsw_avx2(auVar25);
      auVar16 = vpsrlw_avx2(auVar25,auVar14);
      auVar16 = vpsubusw_avx2(auVar27,auVar16);
      auVar25 = vpminsw_avx2(auVar25,auVar16);
      auVar25 = vpaddw_avx2(auVar25,auVar61);
      auVar36 = vpaddw_avx2(auVar25 ^ auVar61,auVar71 ^ auVar36);
      auVar71 = vpsubw_avx2(auVar62,auVar20);
      auVar25 = vpabsw_avx2(auVar71);
      auVar16 = vpsrlw_avx2(auVar25,ZEXT416(uVar5));
      auVar61 = vpsraw_avx2(auVar71,0xf);
      auVar16 = vpsubusw_avx2(auVar27,auVar16);
      auVar25 = vpminsw_avx2(auVar25,auVar16);
      auVar16 = vpaddw_avx2(auVar25,auVar61);
      auVar25 = vpsubw_avx2(auVar72,auVar20);
      auVar73 = vpsraw_avx2(auVar25,0xf);
      auVar25 = vpabsw_avx2(auVar25);
      auVar71 = vpsrlw_avx2(auVar25,ZEXT416(uVar5));
      auVar71 = vpsubusw_avx2(auVar27,auVar71);
      auVar25 = vpminsw_avx2(auVar25,auVar71);
      auVar25 = vpaddw_avx2(auVar25,auVar73);
      auVar25 = vpaddw_avx2(auVar16 ^ auVar61,auVar25 ^ auVar73);
      auVar25 = vpaddw_avx2(auVar25,auVar36);
      auVar25 = vpmullw_avx2(auVar25,auVar17);
      auVar25 = vpaddw_avx2(auVar25,auVar70);
      auVar36 = vpsraw_avx2(auVar25,0xf);
      auVar25 = vpaddw_avx2(auVar25,auVar18);
      auVar25 = vpaddw_avx2(auVar25,auVar36);
      auVar25 = vpsraw_avx2(auVar25,4);
      auVar25 = vpaddw_avx2(auVar25,auVar20);
      *(undefined1 (*) [16])dest = auVar25._16_16_;
      *(undefined1 (*) [16])((long)*(undefined1 (*) [16])dest + (long)dstride * 2) = auVar25._0_16_;
      dest = (void *)((long)*(undefined1 (*) [16])dest + (long)dstride * 4);
      in = (uint16_t *)((long)in + 0x240);
    }
  }
  else {
    uVar5 = sec_damping;
    if (sec_strength != 0) {
      iVar2 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar5 = sec_damping - iVar2;
      if (sec_damping < iVar2) {
        uVar5 = 0;
      }
    }
    auVar25._2_2_ = auVar27._0_2_;
    auVar25._0_2_ = auVar27._0_2_;
    auVar25._4_2_ = auVar27._0_2_;
    auVar25._6_2_ = auVar27._0_2_;
    auVar25._8_2_ = auVar27._0_2_;
    auVar25._10_2_ = auVar27._0_2_;
    auVar25._12_2_ = auVar27._0_2_;
    auVar25._14_2_ = auVar27._0_2_;
    auVar25._16_2_ = auVar27._0_2_;
    auVar25._18_2_ = auVar27._0_2_;
    auVar25._20_2_ = auVar27._0_2_;
    auVar25._22_2_ = auVar27._0_2_;
    auVar25._24_2_ = auVar27._0_2_;
    auVar25._26_2_ = auVar27._0_2_;
    auVar25._28_2_ = auVar27._0_2_;
    auVar25._30_2_ = auVar27._0_2_;
    auVar36._8_2_ = 2;
    auVar36._0_8_ = 0x2000200020002;
    auVar36._10_2_ = 2;
    auVar36._12_2_ = 2;
    auVar36._14_2_ = 2;
    auVar36._16_2_ = 2;
    auVar36._18_2_ = 2;
    auVar36._20_2_ = 2;
    auVar36._22_2_ = 2;
    auVar36._24_2_ = 2;
    auVar36._26_2_ = 2;
    auVar36._28_2_ = 2;
    auVar36._30_2_ = 2;
    auVar16._8_2_ = 1;
    auVar16._0_8_ = 0x1000100010001;
    auVar16._10_2_ = 1;
    auVar16._12_2_ = 1;
    auVar16._14_2_ = 1;
    auVar16._16_2_ = 1;
    auVar16._18_2_ = 1;
    auVar16._20_2_ = 1;
    auVar16._22_2_ = 1;
    auVar16._24_2_ = 1;
    auVar16._26_2_ = 1;
    auVar16._28_2_ = 1;
    auVar16._30_2_ = 1;
    lVar6 = (long)dstride;
    lVar12 = lVar11 * -2;
    lVar13 = lVar4 * -2;
    lVar8 = lVar7 * -2;
    lVar10 = lVar3 * -2;
    auVar70._8_2_ = 8;
    auVar70._0_8_ = 0x8000800080008;
    auVar70._10_2_ = 8;
    auVar70._12_2_ = 8;
    auVar70._14_2_ = 8;
    auVar70._16_2_ = 8;
    auVar70._18_2_ = 8;
    auVar70._20_2_ = 8;
    auVar70._22_2_ = 8;
    auVar70._24_2_ = 8;
    auVar70._26_2_ = 8;
    auVar70._28_2_ = 8;
    auVar70._30_2_ = 8;
    for (lVar9 = 0; lVar9 < block_height; lVar9 = lVar9 + 4) {
      auVar19._8_8_ = 0;
      auVar19._0_8_ = *(ulong *)in;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = *(ulong *)((long)in + 0x120);
      auVar19 = vpunpcklqdq_avx(auVar22,auVar19);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = *(ulong *)((long)in + 0x240);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = *(ulong *)((long)in + 0x360);
      auVar22 = vpunpcklqdq_avx(auVar28,auVar14);
      auVar21._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar22;
      auVar21._16_16_ = ZEXT116(1) * auVar19;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = *(ulong *)((long)in + lVar3 * 2);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = *(ulong *)((long)in + lVar3 * 2 + 0x120);
      auVar19 = vpunpcklqdq_avx(auVar29,auVar23);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = *(ulong *)((long)in + lVar3 * 2 + 0x240);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = *(ulong *)((long)in + lVar3 * 2 + 0x360);
      auVar22 = vpunpcklqdq_avx(auVar37,auVar30);
      auVar71._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar22;
      auVar71._16_16_ = ZEXT116(1) * auVar19;
      auVar61 = vpsubw_avx2(auVar71,auVar21);
      auVar27 = vpabsw_avx2(auVar61);
      auVar71 = vpsrlw_avx2(auVar27,ZEXT416(uVar5));
      auVar26 = vpsraw_avx2(auVar61,0xf);
      auVar71 = vpsubusw_avx2(auVar25,auVar71);
      auVar27 = vpminsw_avx2(auVar71,auVar27);
      auVar71 = vpaddw_avx2(auVar27,auVar26);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(ulong *)((long)in + lVar10);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = *(ulong *)((long)in + lVar10 + 0x120);
      auVar19 = vpunpcklqdq_avx(auVar38,auVar31);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = *(ulong *)((long)in + lVar10 + 0x240);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = *(ulong *)((long)in + lVar10 + 0x360);
      auVar22 = vpunpcklqdq_avx(auVar50,auVar39);
      auVar61._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar22;
      auVar61._16_16_ = ZEXT116(1) * auVar19;
      auVar73 = vpsubw_avx2(auVar61,auVar21);
      auVar27 = vpabsw_avx2(auVar73);
      auVar61 = vpsrlw_avx2(auVar27,ZEXT416(uVar5));
      auVar73 = vpsraw_avx2(auVar73,0xf);
      auVar61 = vpsubusw_avx2(auVar25,auVar61);
      auVar27 = vpminsw_avx2(auVar27,auVar61);
      auVar27 = vpaddw_avx2(auVar27,auVar73);
      auVar71 = vpaddw_avx2(auVar27 ^ auVar73,auVar71 ^ auVar26);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = *(ulong *)((long)in + lVar7 * 2);
      auVar40._8_8_ = 0;
      auVar40._0_8_ = *(ulong *)((long)in + lVar7 * 2 + 0x120);
      auVar19 = vpunpcklqdq_avx(auVar40,auVar32);
      auVar41._8_8_ = 0;
      auVar41._0_8_ = *(ulong *)((long)in + lVar7 * 2 + 0x240);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = *(ulong *)((long)in + lVar7 * 2 + 0x360);
      auVar22 = vpunpcklqdq_avx(auVar51,auVar41);
      auVar73._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar22;
      auVar73._16_16_ = ZEXT116(1) * auVar19;
      auVar27 = vpsubw_avx2(auVar73,auVar21);
      auVar26 = vpsraw_avx2(auVar27,0xf);
      auVar27 = vpabsw_avx2(auVar27);
      auVar14 = ZEXT416(uVar5);
      auVar61 = vpsrlw_avx2(auVar27,auVar14);
      auVar61 = vpsubusw_avx2(auVar25,auVar61);
      auVar27 = vpminsw_avx2(auVar61,auVar27);
      auVar61 = vpaddw_avx2(auVar26,auVar27);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = *(ulong *)((long)in + lVar8);
      auVar52._8_8_ = 0;
      auVar52._0_8_ = *(ulong *)((long)in + lVar8 + 0x120);
      auVar19 = vpunpcklqdq_avx(auVar52,auVar42);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = *(ulong *)((long)in + lVar8 + 0x240);
      auVar65._8_8_ = 0;
      auVar65._0_8_ = *(ulong *)((long)in + lVar8 + 0x360);
      auVar22 = vpunpcklqdq_avx(auVar65,auVar53);
      auVar63._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar22;
      auVar63._16_16_ = ZEXT116(1) * auVar19;
      auVar27 = vpsubw_avx2(auVar63,auVar21);
      auVar63 = vpsraw_avx2(auVar27,0xf);
      auVar27 = vpabsw_avx2(auVar27);
      auVar73 = vpsrlw_avx2(auVar27,auVar14);
      auVar73 = vpsubusw_avx2(auVar25,auVar73);
      auVar27 = vpminsw_avx2(auVar27,auVar73);
      auVar27 = vpaddw_avx2(auVar27,auVar63);
      auVar27 = vpaddw_avx2(auVar27 ^ auVar63,auVar26 ^ auVar61);
      auVar27 = vpaddw_avx2(auVar71,auVar27);
      auVar73 = vpmullw_avx2(auVar27,auVar36);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = *(ulong *)((long)in + lVar4 * 2);
      auVar43._8_8_ = 0;
      auVar43._0_8_ = *(ulong *)((long)in + lVar4 * 2 + 0x120);
      auVar19 = vpunpcklqdq_avx(auVar43,auVar33);
      auVar44._8_8_ = 0;
      auVar44._0_8_ = *(ulong *)((long)in + lVar4 * 2 + 0x240);
      auVar54._8_8_ = 0;
      auVar54._0_8_ = *(ulong *)((long)in + lVar4 * 2 + 0x360);
      auVar22 = vpunpcklqdq_avx(auVar54,auVar44);
      auVar26._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar22;
      auVar26._16_16_ = ZEXT116(1) * auVar19;
      auVar61 = vpsubw_avx2(auVar26,auVar21);
      auVar27 = vpabsw_avx2(auVar61);
      auVar71 = vpsrlw_avx2(auVar27,auVar14);
      auVar63 = vpsraw_avx2(auVar61,0xf);
      auVar71 = vpsubusw_avx2(auVar25,auVar71);
      auVar27 = vpminsw_avx2(auVar27,auVar71);
      auVar71 = vpaddw_avx2(auVar27,auVar63);
      auVar45._8_8_ = 0;
      auVar45._0_8_ = *(ulong *)((long)in + lVar13);
      auVar55._8_8_ = 0;
      auVar55._0_8_ = *(ulong *)((long)in + lVar13 + 0x120);
      auVar19 = vpunpcklqdq_avx(auVar55,auVar45);
      auVar56._8_8_ = 0;
      auVar56._0_8_ = *(ulong *)((long)in + lVar13 + 0x240);
      auVar66._8_8_ = 0;
      auVar66._0_8_ = *(ulong *)((long)in + lVar13 + 0x360);
      auVar22 = vpunpcklqdq_avx(auVar66,auVar56);
      auVar74._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar22;
      auVar74._16_16_ = ZEXT116(1) * auVar19;
      auVar26 = vpsubw_avx2(auVar74,auVar21);
      auVar27 = vpabsw_avx2(auVar26);
      auVar61 = vpsrlw_avx2(auVar27,auVar14);
      auVar26 = vpsraw_avx2(auVar26,0xf);
      auVar61 = vpsubusw_avx2(auVar25,auVar61);
      auVar27 = vpminsw_avx2(auVar27,auVar61);
      auVar27 = vpaddw_avx2(auVar27,auVar26);
      auVar71 = vpaddw_avx2(auVar27 ^ auVar26,auVar71 ^ auVar63);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = *(ulong *)((long)in + lVar11 * 2);
      auVar57._8_8_ = 0;
      auVar57._0_8_ = *(ulong *)((long)in + lVar11 * 2 + 0x120);
      auVar19 = vpunpcklqdq_avx(auVar57,auVar46);
      auVar58._8_8_ = 0;
      auVar58._0_8_ = *(ulong *)((long)in + lVar11 * 2 + 0x240);
      auVar67._8_8_ = 0;
      auVar67._0_8_ = *(ulong *)((long)in + lVar11 * 2 + 0x360);
      auVar22 = vpunpcklqdq_avx(auVar67,auVar58);
      auVar49._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar22;
      auVar49._16_16_ = ZEXT116(1) * auVar19;
      auVar27 = vpsubw_avx2(auVar49,auVar21);
      auVar63 = vpsraw_avx2(auVar27,0xf);
      auVar27 = vpabsw_avx2(auVar27);
      auVar61 = vpsrlw_avx2(auVar27,ZEXT416(uVar5));
      auVar61 = vpsubusw_avx2(auVar25,auVar61);
      auVar27 = vpminsw_avx2(auVar27,auVar61);
      auVar61 = vpaddw_avx2(auVar27,auVar63);
      auVar59._8_8_ = 0;
      auVar59._0_8_ = *(ulong *)((long)in + lVar12);
      auVar68._8_8_ = 0;
      auVar68._0_8_ = *(ulong *)((long)in + lVar12 + 0x120);
      auVar19 = vpunpcklqdq_avx(auVar68,auVar59);
      auVar69._8_8_ = 0;
      auVar69._0_8_ = *(ulong *)((long)in + lVar12 + 0x240);
      auVar75._8_8_ = 0;
      auVar75._0_8_ = *(ulong *)((long)in + lVar12 + 0x360);
      auVar22 = vpunpcklqdq_avx(auVar75,auVar69);
      auVar64._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar22;
      auVar64._16_16_ = ZEXT116(1) * auVar19;
      auVar27 = vpsubw_avx2(auVar64,auVar21);
      auVar74 = vpsraw_avx2(auVar27,0xf);
      auVar27 = vpabsw_avx2(auVar27);
      auVar26 = vpsrlw_avx2(auVar27,ZEXT416(uVar5));
      auVar26 = vpsubusw_avx2(auVar25,auVar26);
      auVar27 = vpminsw_avx2(auVar27,auVar26);
      auVar27 = vpaddw_avx2(auVar27,auVar74);
      auVar27 = vpaddw_avx2(auVar61 ^ auVar63,auVar27 ^ auVar74);
      auVar27 = vpaddw_avx2(auVar27,auVar71);
      auVar27 = vpmullw_avx2(auVar27,auVar16);
      auVar27 = vpaddw_avx2(auVar27,auVar73);
      auVar71 = vpsraw_avx2(auVar27,0xf);
      auVar27 = vpaddw_avx2(auVar27,auVar70);
      auVar27 = vpaddw_avx2(auVar27,auVar71);
      auVar27 = vpsraw_avx2(auVar27,4);
      auVar27 = vpaddw_avx2(auVar27,auVar21);
      uVar1 = vpextrq_avx(auVar27._16_16_,1);
      *(undefined8 *)dest = uVar1;
      *(long *)((long)dest + lVar6 * 2) = auVar27._16_8_;
      uVar1 = vpextrq_avx(auVar27._0_16_,1);
      *(undefined8 *)((long)dest + lVar6 * 4) = uVar1;
      *(long *)((long)dest + lVar6 * 6) = auVar27._0_8_;
      dest = (void *)((long)dest + lVar6 * 8);
      in = (uint16_t *)((long)in + 0x480);
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_16_2)(void *dest, int dstride, const uint16_t *in,
                                 int pri_strength, int sec_strength, int dir,
                                 int pri_damping, int sec_damping,
                                 int coeff_shift, int block_width,
                                 int block_height) {
  if (block_width == 8) {
    filter_block_8x8(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/0,
                     /*enable_secondary=*/1);
  } else {
    filter_block_4x4(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/0,
                     /*enable_secondary=*/1);
  }
}